

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O1

double __thiscall mp::VarVecRecomp::operator[](VarVecRecomp *this,int i)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  int local_2c;
  
  uVar3 = (ulong)i;
  uVar4 = uVar3 + 0x3f;
  if (-1 < (long)uVar3) {
    uVar4 = uVar3;
  }
  uVar2 = (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001);
  if (((this->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
       [((long)uVar4 >> 6) + uVar2 + 0xffffffffffffffff] >> (uVar3 & 0x3f) & 1) == 0) {
    local_2c = i;
    if ((this->recomp_fn_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    dVar5 = (*(this->recomp_fn_)._M_invoker)
                      ((_Any_data *)&this->recomp_fn_,&local_2c,this->p_var_info_recomp_);
    (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar3] = dVar5;
    puVar1 = (this->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
             ((long)uVar4 >> 6) + uVar2 + 0xffffffffffffffff;
    *puVar1 = *puVar1 | 1L << ((byte)i & 0x3f);
  }
  return (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar3];
}

Assistant:

double operator[]( int i ) const {
    assert(i>=0 && i<(int)x_.size());
    assert(p_var_info_recomp_ != nullptr);
    if (!is_recomp_[i]) {
      x_[i] = recomp_fn_(i, *p_var_info_recomp_);
      is_recomp_[i] = true;
    }
    return x_[i];
  }